

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O2

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  uint uVar1;
  FILE *__stream;
  uint16_t i;
  __uid_t _Var2;
  uint uVar3;
  uint32_t uVar4;
  ixy_device *ixy;
  char *pcVar5;
  uint *addr;
  char *pcVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  mempool *pmVar11;
  pkt_buf *ppVar12;
  undefined8 uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong __nmemb;
  long lVar18;
  long *plVar19;
  undefined4 *puVar20;
  ulong uVar21;
  ulong uVar22;
  uint16_t i_1;
  dma_memory dVar23;
  undefined8 uStackY_90;
  ulong in_stack_ffffffffffffff78;
  
  _Var2 = getuid();
  if (_Var2 != 0) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): Not running as root, this will probably fail\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
            ,0x115,"ixgbe_init");
  }
  uVar22 = (ulong)rx_queues;
  if (rx_queues < 0x41) {
    __nmemb = (ulong)tx_queues;
    if (tx_queues < 0x41) {
      ixy = (ixy_device *)malloc(0x58);
      pcVar5 = strdup(pci_addr);
      ixy->pci_addr = pcVar5;
      ixy->driver_name = driver_name;
      ixy->num_rx_queues = rx_queues;
      ixy->num_tx_queues = tx_queues;
      ixy->rx_batch = ixgbe_rx_batch;
      ixy->tx_batch = ixgbe_tx_batch;
      ixy->read_stats = ixgbe_read_stats;
      ixy->set_promisc = ixgbe_set_promisc;
      ixy->get_link_speed = ixgbe_get_link_speed;
      addr = (uint *)pci_map_resource(pci_addr);
      ixy[1].pci_addr = (char *)addr;
      pcVar6 = (char *)calloc(uVar22,0x8018);
      ixy[1].driver_name = pcVar6;
      pvVar7 = calloc(__nmemb,0x8010);
      *(void **)&ixy[1].num_rx_queues = pvVar7;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xe2,"reset_and_init",pcVar5);
      addr[0x222] = 0x7fffffff;
      *addr = 0x4000008;
      while ((*addr & 0x4000008) != 0) {
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 & 0xffffffff00000000;
        fprintf(_stderr,
                "[DEBUG] %s:%d %s(): waiting for flags 0x%08X in register 0x%05X to clear, current value 0x%08X\n"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/device.h"
                ,0x68,"wait_clear_reg32",0x4000008,in_stack_ffffffffffffff78,*addr);
        usleep(10000);
      }
      usleep(10000);
      addr[0x222] = 0x7fffffff;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xee,"reset_and_init",pcVar5);
      wait_set_reg32((uint8_t *)addr,0x10010,0x200);
      wait_set_reg32((uint8_t *)addr,0x2f00,8);
      addr[0x10a8] = addr[0x10a8] & 0xffff1fff | 0x6000;
      addr[0x10a8] = addr[0x10a8] & 0xfffffe7f;
      addr[0x10a8] = addr[0x10a8] | 0x1000;
      ixgbe_read_stats(ixy,(device_stats *)0x0);
      addr[0xc00] = addr[0xc00] & 0xfffffffe;
      addr[0xf00] = 0x20000;
      for (lVar8 = 0xf01; lVar8 != 0xf08; lVar8 = lVar8 + 1) {
        addr[lVar8] = 0;
      }
      addr[0x1090] = addr[0x1090] | 2;
      addr[0xbc0] = addr[0xbc0] | 2;
      addr[0x1420] = addr[0x1420] | 0x400;
      pcVar5 = pcVar6 + 0x12;
      lVar18 = 0x2100;
      lVar8 = 0x1014;
      for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing rx queue %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0x7d,"init_rx",uVar21 & 0xffffffff);
        lVar9 = lVar8;
        if (uVar21 < 0x10) {
          lVar9 = lVar18;
        }
        *(uint *)((long)addr + lVar9) = *(uint *)((long)addr + lVar9) & 0xf1ffffff | 0x2000000;
        if (uVar21 < 0x10) {
          uVar15 = (int)lVar8 - 0x1014;
          uVar3 = (uint)lVar18;
        }
        else {
          uVar15 = (int)uVar21 << 6;
          uVar3 = uVar15 | 0x1014;
        }
        *(uint *)((long)addr + (ulong)uVar3) = *(uint *)((long)addr + (ulong)uVar3) | 0x10000000;
        dVar23 = memory_allocate_dma(0x2000,true);
        pvVar10 = dVar23.virt;
        memset(pvVar10,0xff,0x2000);
        uVar17 = (ulong)uVar15;
        *(int *)((long)addr + uVar17 + 0x1000) = (int)dVar23.phy;
        *(int *)((long)addr + uVar17 + 0x1004) = dVar23.phy._4_4_;
        *(undefined4 *)((long)addr + uVar17 + 0x1008) = 0x2000;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d phy addr:  0x%012lX\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0x8b,"init_rx",uVar21 & 0xffffffff,dVar23.phy);
        fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d virt addr: 0x%012lX\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0x8c,"init_rx",uVar21 & 0xffffffff,pvVar10);
        *(undefined4 *)((long)addr + uVar17 + 0x1010) = 0;
        *(undefined4 *)((long)addr + uVar17 + 0x1018) = 0;
        pcVar5[-2] = '\0';
        pcVar5[-1] = '\x02';
        pcVar5[0] = '\0';
        pcVar5[1] = '\0';
        *(void **)(pcVar5 + -0x12) = pvVar10;
        lVar18 = lVar18 + 4;
        pcVar5 = pcVar5 + 0x18;
        lVar8 = lVar8 + 0x40;
      }
      addr[6] = addr[6] | 0x10000;
      uVar15 = 0x2200;
      uVar14 = 0x100c;
      for (uVar3 = 0; rx_queues != uVar3; uVar3 = uVar3 + 1) {
        uVar1 = uVar14;
        if (uVar3 < 0x10) {
          uVar1 = uVar15;
        }
        *(uint *)((long)addr + (ulong)uVar1) = *(uint *)((long)addr + (ulong)uVar1) & 0xffffefff;
        uVar15 = uVar15 + 4;
        uVar14 = uVar14 + 0x40;
      }
      addr[0xc00] = addr[0xc00] | 1;
      addr[0x1090] = addr[0x1090] | 0x401;
      addr[0x3300] = 0xa000;
      for (lVar8 = 0x3301; lVar8 != 0x3308; lVar8 = lVar8 + 1) {
        addr[lVar8] = 0;
      }
      addr[0x2040] = 0xffff;
      addr[0x1240] = addr[0x1240] & 0xffffffbf;
      lVar8 = 0x180a;
      for (uVar21 = 0; __nmemb != uVar21; uVar21 = uVar21 + 1) {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing tx queue %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0xb4,"init_tx",uVar21 & 0xffffffff);
        dVar23 = memory_allocate_dma(0x2000,true);
        pvVar10 = dVar23.virt;
        memset(pvVar10,0xff,0x2000);
        addr[lVar8 + -10] = (uint)dVar23.phy;
        addr[lVar8 + -9] = dVar23.phy._4_4_;
        addr[lVar8 + -8] = 0x2000;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): tx ring %d phy addr:  0x%012lX\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0xbd,"init_tx",uVar21 & 0xffffffff,dVar23.phy);
        fprintf(_stderr,"[DEBUG] %s:%d %s(): tx ring %d virt addr: 0x%012lX\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0xbe,"init_tx",uVar21 & 0xffffffff,pvVar10);
        addr[lVar8] = addr[lVar8] & 0xffc0c0c0 | 0x40824;
        *(undefined2 *)((long)pvVar7 + lVar8 + -0x1802) = 0x200;
        *(void **)((long)pvVar7 + lVar8 + -0x180a) = pvVar10;
        lVar8 = lVar8 + 0x10;
      }
      addr[0x12a0] = 1;
      uVar21 = 0;
      pcVar5 = pcVar6;
      do {
        pcVar5 = pcVar5 + 0x18;
        if (uVar21 == uVar22) {
          puVar20 = (undefined4 *)((long)pvVar7 + 8);
          lVar8 = 0x6028;
          uVar22 = 0;
          while( true ) {
            if (__nmemb == uVar22) {
              ixgbe_set_promisc(ixy,true);
              fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                      ,0xd4,"wait_for_link");
              iVar16 = -10000000;
              while( true ) {
                uVar4 = ixgbe_get_link_speed(ixy);
                __stream = _stdout;
                if ((uVar4 != 0) || (iVar16 == 0)) break;
                usleep(100000);
                iVar16 = iVar16 + 100000;
              }
              uVar4 = ixgbe_get_link_speed(ixy);
              fprintf(__stream,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                      ,0xdc,"wait_for_link",(ulong)uVar4);
              return ixy;
            }
            fprintf(_stderr,"[DEBUG] %s:%d %s(): starting tx queue %d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                    ,0x5b,"start_tx_queue",uVar22 & 0xffffffff);
            if ((ushort)((ushort)*puVar20 & (ushort)*puVar20 - 1) != 0) break;
            *(undefined4 *)((long)addr + lVar8 + -0x18) = 0;
            *(undefined4 *)((long)addr + lVar8 + -0x10) = 0;
            *(uint *)((long)addr + lVar8) = *(uint *)((long)addr + lVar8) | 0x2000000;
            wait_set_reg32((uint8_t *)addr,(int)lVar8,0x2000000);
            uVar22 = uVar22 + 1;
            puVar20 = puVar20 + 4;
            lVar8 = lVar8 + 0x40;
          }
          pcVar5 = "[ERROR] %s:%d %s(): number of queue entries must be a power of 2\n";
          pcVar6 = "start_tx_queue";
          uStackY_90 = 0x5e;
LAB_00102dd5:
          fprintf(_stderr,pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                  ,uStackY_90,pcVar6);
          abort();
        }
        fprintf(_stderr,"[DEBUG] %s:%d %s(): starting rx queue %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                ,0x39,"start_rx_queue",uVar21 & 0xffffffff);
        lVar8 = uVar21 * 0x18;
        pmVar11 = memory_allocate_mempool(0x1000,0x800);
        *(mempool **)(pcVar6 + lVar8 + 8) = pmVar11;
        uVar3 = *(uint *)(pcVar6 + lVar8 + 0x10);
        if ((ushort)((ushort)uVar3 & (ushort)uVar3 - 1) != 0) {
          pcVar5 = "[ERROR] %s:%d %s(): number of queue entries must be a power of 2\n";
          pcVar6 = "start_rx_queue";
          uStackY_90 = 0x44;
          goto LAB_00102dd5;
        }
        plVar19 = (long *)(pcVar6 + lVar8);
        lVar8 = 8;
        for (uVar17 = 0; uVar17 < (uVar3 & 0xffff); uVar17 = uVar17 + 1) {
          lVar18 = *plVar19;
          ppVar12 = pkt_buf_alloc((mempool *)plVar19[1]);
          if (ppVar12 == (pkt_buf *)0x0) {
            pcVar5 = "[ERROR] %s:%d %s(): failed to allocate rx descriptor\n";
            pcVar6 = "start_rx_queue";
            uStackY_90 = 0x4a;
            goto LAB_00102dd5;
          }
          *(uintptr_t *)(lVar18 + -8 + lVar8) = ppVar12->buf_addr_phy + 0x40;
          *(undefined8 *)(lVar18 + lVar8) = 0;
          *(pkt_buf **)(pcVar5 + uVar17 * 8) = ppVar12;
          uVar3 = (uint)*(ushort *)(plVar19 + 2);
          lVar8 = lVar8 + 0x10;
        }
        uVar17 = uVar21 & 0xffffffff;
        addr[uVar17 * 0x10 + 0x40a] = addr[uVar17 * 0x10 + 0x40a] | 0x2000000;
        wait_set_reg32((uint8_t *)addr,(int)uVar21 * 0x40 + 0x1028,0x2000000);
        addr[uVar17 * 0x10 + 0x404] = 0;
        addr[uVar17 * 0x10 + 0x406] = *(ushort *)(plVar19 + 2) - 1;
        uVar21 = uVar21 + 1;
      } while( true );
    }
    pcVar5 = "[ERROR] %s:%d %s(): cannot configure %d tx queues: limit is %d\n";
    uVar13 = 0x11b;
    uVar22 = __nmemb;
  }
  else {
    pcVar5 = "[ERROR] %s:%d %s(): cannot configure %d rx queues: limit is %d\n";
    uVar13 = 0x118;
  }
  fprintf(_stderr,pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
          ,uVar13,"ixgbe_init",uVar22,CONCAT44((int)(in_stack_ffffffffffffff78 >> 0x20),0x40));
  abort();
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->addr = pci_map_resource(pci_addr);
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}